

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Erat.cpp
# Opt level: O2

void __thiscall primesieve::Erat::preSieve(Erat *this)

{
  byte *pbVar1;
  
  PreSieve::preSieve(&this->sieve_,this->segmentLow_);
  if (this->segmentLow_ <= this->start_) {
    pbVar1 = (this->sieve_).array_;
    *pbVar1 = *pbVar1 & (anonymous_namespace)::unsetSmaller[(this->start_ - 7) % 0x1e + 7];
  }
  return;
}

Assistant:

void Erat::preSieve()
{
  PreSieve::preSieve(sieve_, segmentLow_);

  // unset bits < start
  if (segmentLow_ <= start_)
  {
    uint64_t rem = byteRemainder(start_);
    sieve_[0] &= unsetSmaller[rem];
  }
}